

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int MemHashGrowTable(mem_hash_kv_engine *pEngine)

{
  sxu32 sVar1;
  mem_hash_record *pmVar2;
  sxu32 sVar3;
  uint uVar4;
  mem_hash_record **pSrc;
  uint local_34;
  sxu32 iBucket;
  sxu32 n;
  mem_hash_record **apNew;
  mem_hash_record *pEntry;
  sxu32 nNewSize;
  mem_hash_kv_engine *pEngine_local;
  
  sVar1 = pEngine->nBucket;
  sVar3 = sVar1 * 2;
  pSrc = (mem_hash_record **)SyMemBackendAlloc(&pEngine->sAlloc,sVar1 << 4);
  if (pSrc != (mem_hash_record **)0x0) {
    SyZero(pSrc,sVar1 << 4);
    local_34 = 0;
    apNew = (mem_hash_record **)pEngine->pLast;
    for (; local_34 < pEngine->nRecord; local_34 = local_34 + 4) {
      apNew[9] = (mem_hash_record *)0x0;
      apNew[8] = (mem_hash_record *)0x0;
      uVar4 = *(uint *)(apNew + 1) & sVar3 - 1;
      apNew[8] = pSrc[uVar4];
      if (pSrc[uVar4] != (mem_hash_record *)0x0) {
        pSrc[uVar4]->pPrevHash = (mem_hash_record *)apNew;
      }
      pSrc[uVar4] = (mem_hash_record *)apNew;
      pmVar2 = apNew[6];
      if (pEngine->nRecord <= local_34 + 1) break;
      pmVar2->pPrevHash = (mem_hash_record *)0x0;
      pmVar2->pNextHash = (mem_hash_record *)0x0;
      uVar4 = pmVar2->nHash & sVar3 - 1;
      pmVar2->pNextHash = pSrc[uVar4];
      if (pSrc[uVar4] != (mem_hash_record *)0x0) {
        pSrc[uVar4]->pPrevHash = pmVar2;
      }
      pSrc[uVar4] = pmVar2;
      pmVar2 = pmVar2->pNext;
      if (pEngine->nRecord <= local_34 + 2) break;
      pmVar2->pPrevHash = (mem_hash_record *)0x0;
      pmVar2->pNextHash = (mem_hash_record *)0x0;
      uVar4 = pmVar2->nHash & sVar3 - 1;
      pmVar2->pNextHash = pSrc[uVar4];
      if (pSrc[uVar4] != (mem_hash_record *)0x0) {
        pSrc[uVar4]->pPrevHash = pmVar2;
      }
      pSrc[uVar4] = pmVar2;
      pmVar2 = pmVar2->pNext;
      if (pEngine->nRecord <= local_34 + 3) break;
      pmVar2->pPrevHash = (mem_hash_record *)0x0;
      pmVar2->pNextHash = (mem_hash_record *)0x0;
      uVar4 = pmVar2->nHash & sVar3 - 1;
      pmVar2->pNextHash = pSrc[uVar4];
      if (pSrc[uVar4] != (mem_hash_record *)0x0) {
        pSrc[uVar4]->pPrevHash = pmVar2;
      }
      pSrc[uVar4] = pmVar2;
      apNew = (mem_hash_record **)pmVar2->pNext;
    }
    SyMemBackendFree(&pEngine->sAlloc,pEngine->apBucket);
    pEngine->apBucket = pSrc;
    pEngine->nBucket = sVar3;
  }
  return 0;
}

Assistant:

static int MemHashGrowTable(mem_hash_kv_engine *pEngine)
{
	sxu32 nNewSize = pEngine->nBucket << 1;
	mem_hash_record *pEntry;
	mem_hash_record **apNew;
	sxu32 n,iBucket;
	/* Allocate a new larger table */
	apNew = (mem_hash_record **)SyMemBackendAlloc(&pEngine->sAlloc, nNewSize * sizeof(mem_hash_record *));
	if( apNew == 0 ){
		/* Not so fatal, simply a performance hit */
		return UNQLITE_OK;
	}
	/* Zero the new table */
	SyZero((void *)apNew, nNewSize * sizeof(mem_hash_record *));
	/* Rehash all entries */
	n = 0;
	pEntry = pEngine->pLast;
	for(;;){
		
		/* Loop one */
		if( n >= pEngine->nRecord ){
			break;
		}
		pEntry->pNextHash = pEntry->pPrevHash = 0;
		/* Install in the new bucket */
		iBucket = pEntry->nHash & (nNewSize - 1);
		pEntry->pNextHash = apNew[iBucket];
		if( apNew[iBucket] ){
			apNew[iBucket]->pPrevHash = pEntry;
		}
		apNew[iBucket] = pEntry;
		/* Point to the next entry */
		pEntry = pEntry->pNext;
		n++;

		/* Loop two */
		if( n >= pEngine->nRecord ){
			break;
		}
		pEntry->pNextHash = pEntry->pPrevHash = 0;
		/* Install in the new bucket */
		iBucket = pEntry->nHash & (nNewSize - 1);
		pEntry->pNextHash = apNew[iBucket];
		if( apNew[iBucket] ){
			apNew[iBucket]->pPrevHash = pEntry;
		}
		apNew[iBucket] = pEntry;
		/* Point to the next entry */
		pEntry = pEntry->pNext;
		n++;

		/* Loop three */
		if( n >= pEngine->nRecord ){
			break;
		}
		pEntry->pNextHash = pEntry->pPrevHash = 0;
		/* Install in the new bucket */
		iBucket = pEntry->nHash & (nNewSize - 1);
		pEntry->pNextHash = apNew[iBucket];
		if( apNew[iBucket] ){
			apNew[iBucket]->pPrevHash = pEntry;
		}
		apNew[iBucket] = pEntry;
		/* Point to the next entry */
		pEntry = pEntry->pNext;
		n++;

		/* Loop four */
		if( n >= pEngine->nRecord ){
			break;
		}
		pEntry->pNextHash = pEntry->pPrevHash = 0;
		/* Install in the new bucket */
		iBucket = pEntry->nHash & (nNewSize - 1);
		pEntry->pNextHash = apNew[iBucket];
		if( apNew[iBucket] ){
			apNew[iBucket]->pPrevHash = pEntry;
		}
		apNew[iBucket] = pEntry;
		/* Point to the next entry */
		pEntry = pEntry->pNext;
		n++;
	}
	/* Release the old table and reflect the change */
	SyMemBackendFree(&pEngine->sAlloc,(void *)pEngine->apBucket);
	pEngine->apBucket = apNew;
	pEngine->nBucket  = nNewSize;
	return UNQLITE_OK;
}